

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

void __thiscall String::reserve(String *this,usize size)

{
  usize copyLength;
  
  copyLength = this->data->len;
  if (size < copyLength) {
    size = copyLength;
  }
  detach(this,copyLength,size);
  return;
}

Assistant:

String& prepend(const String& str)
  {
    String copy(*this);
    usize newLen = str.data->len + copy.data->len;
    detach(0, newLen);
    Memory::copy((char*)data->str, str.data->str, str.data->len * sizeof(char));
    Memory::copy((char*)data->str + str.data->len, copy.data->str, copy.data->len * sizeof(char));
    ((char*)data->str)[data->len = newLen] = '\0';
    return *this;
  }